

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readpsm.c
# Opt level: O0

int it_entry_compare(IT_ENTRY *e1,IT_ENTRY *e2)

{
  IT_ENTRY *e2_local;
  IT_ENTRY *e1_local;
  int local_4;
  
  if ((e1->channel < 0x40) || (e2->channel < 0x40)) {
    if (e1->channel == e2->channel) {
      if (e1->mask == e2->mask) {
        if (((e1->mask & 1) == 0) || (e1->note == e2->note)) {
          if (((e1->mask & 2) == 0) || (e1->instrument == e2->instrument)) {
            if (((e1->mask & 4) == 0) || (e1->volpan == e2->volpan)) {
              if (((e1->mask & 8) == 0) ||
                 ((e1->effect == e2->effect && (e1->effectvalue == e2->effectvalue)))) {
                local_4 = 1;
              }
              else {
                local_4 = 0;
              }
            }
            else {
              local_4 = 0;
            }
          }
          else {
            local_4 = 0;
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int CDECL it_entry_compare(const IT_ENTRY * e1, const IT_ENTRY * e2) {
	if (IT_IS_END_ROW(e1) && IT_IS_END_ROW(e2)) return 1;
	if (e1->channel != e2->channel) return 0;
	if (e1->mask != e2->mask) return 0;
	if ((e1->mask & IT_ENTRY_NOTE) && (e1->note != e2->note)) return 0;
	if ((e1->mask & IT_ENTRY_INSTRUMENT) && (e1->instrument != e2->instrument)) return 0;
	if ((e1->mask & IT_ENTRY_VOLPAN) && (e1->volpan != e2->volpan)) return 0;
	if ((e1->mask & IT_ENTRY_EFFECT) && ((e1->effect != e2->effect) || (e1->effectvalue != e2->effectvalue))) return 0;
	return 1;
}